

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# representation.cpp
# Opt level: O0

bool KingFacing(Situation *situation)

{
  int iVar1;
  uint position;
  uint position_00;
  int iVar2;
  long in_RDI;
  int black_king_pos;
  int red_king_pos;
  bool local_1;
  
  iVar1 = GetPlayerFlag(0);
  position = (uint)*(byte *)(in_RDI + 0x104 + (long)iVar1);
  iVar1 = GetPlayerFlag(1);
  position_00 = (uint)*(byte *)(in_RDI + 0x104 + (long)iVar1);
  if ((position == 0) || (position_00 == 0)) {
    local_1 = false;
  }
  else {
    iVar1 = GetCol(position);
    iVar2 = GetCol(position_00);
    if (iVar1 == iVar2) {
      iVar1 = GetRow(position);
      iVar2 = GetCol(position);
      local_1 = (*(ushort *)
                  ((long)(iVar1 + -3) * 0x2000 + 0x339d82 +
                  (ulong)*(ushort *)(in_RDI + 0x154 + (long)iVar2 * 2) * 8) &
                BIT_COL_MASK[(int)position_00]) != 0;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool KingFacing(const Situation & situation){
    // 1. 如果有一方没有将 则无效
    int red_king_pos = situation.current_pieces[GetPlayerFlag(RED) + 0], black_king_pos = situation.current_pieces[GetPlayerFlag(BLACK) + 0];
    if(red_king_pos == 0 || black_king_pos == 0){
        return false;
    }
    // 2. 先判断两个将是否在同一列
    if(GetCol(red_king_pos) != GetCol(black_king_pos)){
        return false;
    }
    // 3. 判断是否对将
    return (ROOK_CANNON_CAN_GET_COL_MASK[GetRow(red_king_pos) - 3][situation.bit_col[GetCol(red_king_pos)]].rook_capture & BIT_COL_MASK[black_king_pos]) != 0;
}